

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

size_t al_fread(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  iVar1 = f->ungetc_len;
  if (iVar1 == 0) {
    sVar2 = (*f->vtable->fi_fread)(f,ptr,size);
    return sVar2;
  }
  if (size == 0 || iVar1 < 1) {
    lVar3 = 0;
  }
  else {
    lVar4 = 0;
    do {
      f->ungetc_len = iVar1 - 1U;
      *(uchar *)((long)ptr + lVar4) = f->ungetc[iVar1 - 1U];
      iVar1 = f->ungetc_len;
      lVar3 = lVar4 + 1;
      if (iVar1 < 1) break;
      bVar5 = size - 1 != lVar4;
      lVar4 = lVar3;
    } while (bVar5);
    ptr = (void *)((long)ptr + lVar3);
    size = size - lVar3;
  }
  sVar2 = (*f->vtable->fi_fread)(f,ptr,size);
  return sVar2 + lVar3;
}

Assistant:

size_t al_fread(ALLEGRO_FILE *f, void *ptr, size_t size)
{
   ASSERT(f);
   ASSERT(ptr || size == 0);

   if (f->ungetc_len) {
      int bytes_ungetc = 0;
      unsigned char *cptr = ptr;

      while (f->ungetc_len > 0 && size > 0) {
         *cptr++ = f->ungetc[--f->ungetc_len];
         ++bytes_ungetc;
         --size;
      }

      return bytes_ungetc + f->vtable->fi_fread(f, cptr, size);
   }
   else {
      return f->vtable->fi_fread(f, ptr, size);
   }
}